

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O0

Object * __thiscall
nvim::NvimRPC::do_call<>(Object *__return_storage_ptr__,NvimRPC *this,string *method)

{
  packer<msgpack::v1::sbuffer> *o;
  type ppVar1;
  char *pcVar2;
  void *__buf;
  object *poVar3;
  type *ptVar4;
  NvimRPC *__n;
  undefined1 local_f8 [8];
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  dst;
  object obj;
  unpacked result;
  unsigned_long local_58 [3];
  packer<msgpack::v1::sbuffer> local_40;
  Packer pk;
  sbuffer sbuf;
  string *method_local;
  NvimRPC *this_local;
  
  msgpack::v1::sbuffer::sbuffer((sbuffer *)&pk,0x2000);
  msgpack::v1::packer<msgpack::v1::sbuffer>::packer(&local_40,(sbuffer *)&pk);
  o = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_40,4);
  local_58[0] = 0;
  ppVar1 = msgpack::v1::operator<<(o,local_58);
  result.m_zone._M_t.
  super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       this->msgid_;
  this->msgid_ = (long)result.m_zone._M_t.
                       super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                       .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl + 1;
  __n = this;
  ppVar1 = msgpack::v1::operator<<(ppVar1,(unsigned_long *)&result.m_zone);
  msgpack::v1::operator<<(ppVar1,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_40,0);
  nvim::detail::pack(&local_40);
  pcVar2 = msgpack::v1::sbuffer::data((sbuffer *)&pk);
  __buf = (void *)msgpack::v1::sbuffer::size((sbuffer *)&pk);
  Socket::write(&this->socket_,(int)pcVar2,__buf,(size_t)__n);
  Socket::read2((unpacked *)((long)&obj.super_object.via + 8),&this->socket_,5.0);
  poVar3 = msgpack::v1::object_handle::get((object_handle *)((long)&obj.super_object.via + 8));
  obj.super_object.via.u64 = (uint64_t)(poVar3->super_object).via.array.ptr;
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = *(long *)&poVar3->super_object;
  obj.super_object._0_8_ = (poVar3->super_object).via.u64;
  msgpack::v1::type::
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  ::tuple<>((tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             *)local_f8);
  msgpack::v2::object::
  convert<msgpack::v1::type::tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>
            ((object *)
             &dst.
              super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .super__Head_base<0UL,_long,_false>,
             (tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              *)local_f8);
  ptVar4 = msgpack::v1::type::
           tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
           ::get<3ul>((tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
                       *)local_f8);
  msgpack::v1::type::
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  ::basic_variant(__return_storage_ptr__,ptVar4);
  msgpack::v1::type::
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  ::~tuple((tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
            *)local_f8);
  msgpack::v1::object_handle::~object_handle((object_handle *)((long)&obj.super_object.via + 8));
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)&pk);
  return __return_storage_ptr__;
}

Assistant:

Object NvimRPC::do_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    // msgpack::object_handle oh = msgpack::unpack(sbuf.data(), sbuf.size());
    // msgpack::object deserialized = oh.get();
    // std::cout << "sbuf = " << deserialized << std::endl;

    socket_.write(sbuf.data(), sbuf.size(), 5);

    msgpack::unpacked result = socket_.read2(5);
    msgpack::object obj(result.get());

    //TODO: full-state response handler should be implemented

    // std::cout << "res = " << obj << std::endl;
    msgpack::type::tuple<int64_t, int64_t, Object, Object> dst;
    // [type=1, msgid(uint), error(str?), result(...)]
    obj.convert(dst);
    return dst.get<3>();
}